

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

void Sle_ManStop(Sle_Man_t *p)

{
  sat_solver_delete(p->pSat);
  Vec_BitFree(p->vMask);
  Vec_IntFree(p->vCuts);
  Vec_WecFree(p->vCutFanins);
  Vec_WecFree(p->vFanoutEdges);
  Vec_WecFree(p->vEdgeCuts);
  Vec_IntFree(p->vObjMap);
  Vec_IntFree(p->vCutFirst);
  Vec_IntFree(p->vEdgeFirst);
  Vec_IntFree(p->vDelayFirst);
  Vec_IntFree(p->vPolars);
  Vec_IntFree(p->vLits);
  free(p);
  return;
}

Assistant:

void Sle_ManStop( Sle_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_BitFree( p->vMask );
    Vec_IntFree( p->vCuts );
    Vec_WecFree( p->vCutFanins );
    Vec_WecFree( p->vFanoutEdges );
    Vec_WecFree( p->vEdgeCuts );
    Vec_IntFree( p->vObjMap );
    Vec_IntFree( p->vCutFirst );
    Vec_IntFree( p->vEdgeFirst );
    Vec_IntFree( p->vDelayFirst );
    Vec_IntFree( p->vPolars );
    Vec_IntFree( p->vLits );
    ABC_FREE( p );
}